

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O2

FBaseCVar * GetCVar(AActor *activator,char *cvarname)

{
  FBaseCVar *pFVar1;
  
  pFVar1 = FindCVar(cvarname,(FBaseCVar **)0x0);
  if ((pFVar1 != (FBaseCVar *)0x0) && ((pFVar1->Flags >> 0xe & 1) == 0)) {
    if ((pFVar1->Flags & 2) == 0) {
      return pFVar1;
    }
    if ((activator != (AActor *)0x0) && (activator->player != (player_t *)0x0)) {
      pFVar1 = GetUserCVar((int)((long)(activator->player[-0x3b4b].frags + 7) / 0x2a0),cvarname);
      return pFVar1;
    }
  }
  return (FBaseCVar *)0x0;
}

Assistant:

FBaseCVar *GetCVar(AActor *activator, const char *cvarname)
{
	FBaseCVar *cvar = FindCVar(cvarname, nullptr);
	// Either the cvar doesn't exist, or it's for a mod that isn't loaded, so return nullptr.
	if (cvar == nullptr || (cvar->GetFlags() & CVAR_IGNORE))
	{
		return nullptr;
	}
	else
	{
		// For userinfo cvars, redirect to GetUserCVar
		if (cvar->GetFlags() & CVAR_USERINFO)
		{
			if (activator == nullptr || activator->player == nullptr)
			{
				return nullptr;
			}
			return GetUserCVar(int(activator->player - players), cvarname);
		}
		return cvar;
	}
}